

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O2

void __thiscall chrono::ChContinuumSPH::ArchiveOUT(ChContinuumSPH *this,ChArchiveOut *marchive)

{
  ChNameValue<double> local_60;
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChContinuumSPH>(marchive);
  fea::ChContinuumMaterial::ArchiveOUT(&this->super_ChContinuumMaterial,marchive);
  local_30._value = &this->viscosity;
  local_30._name = "viscosity";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->surface_tension;
  local_48._name = "surface_tension";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->pressure_stiffness;
  local_60._name = "pressure_stiffness";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  return;
}

Assistant:

void ChContinuumSPH::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChContinuumSPH>();

    // serialize parent class
    ChContinuumMaterial::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(viscosity);
    marchive << CHNVP(surface_tension);
    marchive << CHNVP(pressure_stiffness);
}